

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O2

void vkt::memory::anon_unknown_0::populateTestGroup(TestCaseGroup *group)

{
  undefined1 uVar1;
  TestContext *testCtx;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  allocator<char> local_221;
  TestNode *local_220;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferGroup;
  string local_1c8;
  ostringstream caseName;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_220 = &group->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,(group->super_TestNode).m_testCtx,"buffer","");
  lVar6 = 8;
  bufferGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar2;
  while( true ) {
    pTVar2 = bufferGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar3 = local_220;
    if (lVar6 == 0x58) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseName,*(char **)((long)&DAT_00bd4f80 + lVar6),
               (allocator<char> *)&imageGroup);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_221);
    addFunctionCase<unsigned_int>
              (pTVar2,(string *)&caseName,&local_1c8,testBuffer,*(uint *)(&UNK_00bd4f78 + lVar6));
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&caseName);
    lVar6 = lVar6 + 0x10;
  }
  bufferGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_220,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&bufferGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3->m_testCtx,"image","");
  imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar2;
  for (lVar6 = 0;
      pTVar2 = imageGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar6 != 6; lVar6 = lVar6 + 1) {
    iVar5 = 2;
    while (iVar5 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
      pcVar4 = (pointer)(ulong)(uint)(&DAT_00bd4fd0)[lVar6 * 4];
      uVar1 = (&DAT_00bd4fd4)[lVar6 * 0x10];
      std::operator<<((ostream *)&caseName,(&PTR_anon_var_dwarf_9dde88_00bd4fd8)[lVar6 * 2]);
      if (iVar5 == 2) {
        std::operator<<((ostream *)&caseName,"_tiling_linear");
        pcVar4 = (pointer)((ulong)pcVar4 | 0x100000000);
      }
      else {
        std::operator<<((ostream *)&caseName,"_tiling_optimal");
      }
      pTVar2 = imageGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      if (((ulong)pcVar4 & 0x100000002) != 0x100000002) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>((string *)&bufferGroup,"",&local_221);
        testCtx = (pTVar2->super_TestNode).m_testCtx;
        pTVar3 = (TestNode *)operator_new(0x90);
        TestCase::TestCase((TestCase *)pTVar3,testCtx,NODETYPE_SELF_VALIDATE,&local_1c8,
                           (string *)&bufferGroup);
        pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bd5040;
        pTVar3[1].m_testCtx = (TestContext *)testImage;
        pTVar3[1].m_name._M_dataplus._M_p = pcVar4;
        *(undefined1 *)&pTVar3[1].m_name._M_string_length = uVar1;
        tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
        std::__cxx11::string::~string((string *)&bufferGroup);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
      iVar5 = iVar5 + -1;
    }
  }
  imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_220,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&imageGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return;
}

Assistant:

void populateTestGroup (tcu::TestCaseGroup* group)
{
	// Buffers
	{
		const struct
		{
			VkBufferCreateFlags		flags;
			const char* const		name;
		} bufferCases[] =
		{
			{ (VkBufferCreateFlags)0,																								"regular"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT,																					"sparse"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,											"sparse_residency"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT											| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_aliased"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> bufferGroup(new tcu::TestCaseGroup(group->getTestContext(), "buffer", ""));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bufferCases); ++ndx)
			addFunctionCase(bufferGroup.get(), bufferCases[ndx].name, "", testBuffer, bufferCases[ndx].flags);

		group->addChild(bufferGroup.release());
	}

	// Images
	{
		const struct
		{
			VkImageCreateFlags		flags;
			bool					transient;
			const char* const		name;
		} imageFlagsCases[] =
		{
			{ (VkImageCreateFlags)0,																								false,	"regular"					},
			{ (VkImageCreateFlags)0,																								true,	"transient"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT,																					false,	"sparse"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT,											false,	"sparse_residency"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT											| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_aliased"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT		| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(group->getTestContext(), "image", ""));

		for (int flagsNdx = 0; flagsNdx < DE_LENGTH_OF_ARRAY(imageFlagsCases); ++flagsNdx)
		for (int tilingNdx = 0; tilingNdx <= 1; ++tilingNdx)
		{
			ImageParams			params;
			std::ostringstream	caseName;

			params.flags		=  imageFlagsCases[flagsNdx].flags;
			params.transient	=  imageFlagsCases[flagsNdx].transient;
			caseName			<< imageFlagsCases[flagsNdx].name;

			if (tilingNdx != 0)
			{
				params.tiling =  VK_IMAGE_TILING_OPTIMAL;
				caseName      << "_tiling_optimal";
			}
			else
			{
				params.tiling =  VK_IMAGE_TILING_LINEAR;
				caseName      << "_tiling_linear";
			}

			if ((params.flags & VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT) && (params.tiling == VK_IMAGE_TILING_LINEAR))
				continue;

			addFunctionCase(imageGroup.get(), caseName.str(), "", testImage, params);
		}

		group->addChild(imageGroup.release());
	}
}